

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::Psbt::CreateRecordKey(ByteData *__return_storage_ptr__,uint8_t type,string *key)

{
  uint8_t *buffer;
  char *__s;
  size_t sVar1;
  ByteData local_38;
  string *local_20;
  string *key_local;
  ByteData *pBStack_10;
  uint8_t type_local;
  
  local_20 = key;
  key_local._7_1_ = type;
  pBStack_10 = __return_storage_ptr__;
  buffer = (uint8_t *)::std::__cxx11::string::data();
  __s = (char *)::std::__cxx11::string::c_str();
  sVar1 = strlen(__s);
  ByteData::ByteData(&local_38,buffer,(uint32_t)sVar1);
  CreateRecordKey(__return_storage_ptr__,type,&local_38);
  ByteData::~ByteData(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(uint8_t type, const std::string &key) {
  return CreateRecordKey(
      type, ByteData(
                reinterpret_cast<const uint8_t *>(key.data()),
                static_cast<uint32_t>(strlen(key.c_str()))));
}